

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O3

int Ivy_FastMapMerge(Ivy_Supp_t *pSupp0,Ivy_Supp_t *pSupp1,Ivy_Supp_t *pSupp,int nLimit)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  bVar1 = pSupp0->nSize;
  uVar6 = (ulong)bVar1;
  cVar2 = pSupp1->nSize;
  uVar7 = (uint)cVar2;
  if ((char)bVar1 < cVar2) {
    __assert_fail("pSupp0->nSize >= pSupp1->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                  ,0x2c6,"int Ivy_FastMapMerge(Ivy_Supp_t *, Ivy_Supp_t *, Ivy_Supp_t *, int)");
  }
  iVar9 = (int)(char)bVar1;
  if (uVar7 == nLimit && iVar9 == nLimit) {
    if ('\0' < (char)bVar1) {
      uVar8 = 0;
      do {
        if (*(int *)(&pSupp0[1].nSize + uVar8 * 4) != *(int *)(&pSupp1[1].nSize + uVar8 * 4)) {
          return 0;
        }
        uVar8 = uVar8 + 1;
      } while ((uint)nLimit != uVar8);
      if ('\0' < (char)bVar1) {
        uVar8 = 0;
        do {
          *(undefined4 *)(&pSupp[1].nSize + uVar8 * 4) =
               *(undefined4 *)(&pSupp0[1].nSize + uVar8 * 4);
          uVar8 = uVar8 + 1;
        } while ((uint)nLimit != uVar8);
      }
    }
  }
  else if (iVar9 == nLimit) {
    if ('\0' < cVar2) {
      uVar10 = 0;
      uVar8 = (ulong)(uint)nLimit;
LAB_007a0ba9:
      do {
        if ((int)uVar8 < 1) {
          if (uVar8 == 0) {
            return 0;
          }
        }
        else {
          lVar12 = uVar8 * 2;
          uVar8 = uVar8 - 1;
          if (*(int *)(&pSupp0->Delay + lVar12) != *(int *)(&pSupp1[1].nSize + uVar10 * 4))
          goto LAB_007a0ba9;
        }
        uVar10 = uVar10 + 1;
        uVar8 = (ulong)(uint)nLimit;
      } while (uVar10 != uVar7);
    }
    if ('\0' < (char)bVar1) {
      uVar8 = 0;
      do {
        *(undefined4 *)(&pSupp[1].nSize + uVar8 * 4) = *(undefined4 *)(&pSupp0[1].nSize + uVar8 * 4)
        ;
        uVar8 = uVar8 + 1;
      } while ((uint)nLimit != uVar8);
    }
  }
  else {
    if (nLimit < 1) {
      iVar11 = 0;
      uVar5 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar5 = 0;
      iVar11 = 0;
      do {
        if (uVar5 == uVar7) {
          if (iVar11 == iVar9) goto LAB_007a0c9a;
          *(undefined4 *)(&pSupp[1].nSize + uVar6 * 4) =
               *(undefined4 *)(&pSupp0[1].nSize + (long)iVar11 * 4);
          iVar11 = iVar11 + 1;
          uVar5 = uVar7;
        }
        else {
          lVar12 = (long)(int)uVar5;
          if (iVar11 == iVar9) {
            uVar5 = uVar5 + 1;
            *(undefined4 *)(&pSupp[1].nSize + uVar6 * 4) =
                 *(undefined4 *)(&pSupp1[1].nSize + lVar12 * 4);
            iVar11 = iVar9;
          }
          else {
            iVar3 = *(int *)(&pSupp0[1].nSize + (long)iVar11 * 4);
            iVar4 = *(int *)(&pSupp1[1].nSize + lVar12 * 4);
            if (iVar3 < iVar4) {
              iVar11 = iVar11 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar3;
            }
            else if (iVar4 < iVar3) {
              uVar5 = uVar5 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar4;
            }
            else {
              iVar11 = iVar11 + 1;
              *(int *)(&pSupp[1].nSize + uVar6 * 4) = iVar3;
              uVar5 = uVar5 + 1;
            }
          }
        }
        uVar6 = uVar6 + 1;
      } while ((uint)nLimit != uVar6);
      uVar6 = (ulong)(uint)nLimit;
    }
    if ((int)uVar5 < (int)uVar7 || iVar11 < iVar9) {
      return 0;
    }
  }
LAB_007a0c9a:
  pSupp->nSize = (char)uVar6;
  return 1;
}

Assistant:

int Ivy_FastMapMerge( Ivy_Supp_t * pSupp0, Ivy_Supp_t * pSupp1, Ivy_Supp_t * pSupp, int nLimit )
{ 
    int i, k, c;
    assert( pSupp0->nSize >= pSupp1->nSize );
    // the case of the largest cut sizes
    if ( pSupp0->nSize == nLimit && pSupp1->nSize == nLimit )
    {
        for ( i = 0; i < pSupp0->nSize; i++ )
            if ( pSupp0->pArray[i] != pSupp1->pArray[i] )
                return 0;
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }
    // the case when one of the cuts is the largest
    if ( pSupp0->nSize == nLimit )
    {
        for ( i = 0; i < pSupp1->nSize; i++ )
        {
            for ( k = pSupp0->nSize - 1; k >= 0; k-- )
                if ( pSupp0->pArray[k] == pSupp1->pArray[i] )
                    break;
            if ( k == -1 ) // did not find
                return 0;
        }
        for ( i = 0; i < pSupp0->nSize; i++ )
            pSupp->pArray[i] = pSupp0->pArray[i];
        pSupp->nSize = pSupp0->nSize;
        return 1;
    }

    // compare two cuts with different numbers
    i = k = 0;
    for ( c = 0; c < nLimit; c++ )
    {
        if ( k == pSupp1->nSize )
        {
            if ( i == pSupp0->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( i == pSupp0->nSize )
        {
            if ( k == pSupp1->nSize )
            {
                pSupp->nSize = c;
                return 1;
            }
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        if ( pSupp0->pArray[i] < pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp0->pArray[i++];
            continue;
        }
        if ( pSupp0->pArray[i] > pSupp1->pArray[k] )
        {
            pSupp->pArray[c] = pSupp1->pArray[k++];
            continue;
        }
        pSupp->pArray[c] = pSupp0->pArray[i++]; 
        k++;
    }
    if ( i < pSupp0->nSize || k < pSupp1->nSize )
        return 0;
    pSupp->nSize = c;
    return 1;
}